

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_i2d_fp.cc
# Opt level: O0

int ASN1_item_i2d_fp(ASN1_ITEM *it,FILE *out,void *x)

{
  BIO *out_00;
  int ret;
  BIO *b;
  void *x_local;
  FILE *out_local;
  ASN1_ITEM *it_local;
  
  out_00 = BIO_new_fp(out,0);
  if (out_00 == (BIO *)0x0) {
    ERR_put_error(0xc,0,7,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/a_i2d_fp.cc"
                  ,0x19);
    it_local._4_4_ = 0;
  }
  else {
    it_local._4_4_ = ASN1_item_i2d_bio(it,out_00,x);
    BIO_free(out_00);
  }
  return it_local._4_4_;
}

Assistant:

int ASN1_item_i2d_fp(const ASN1_ITEM *it, FILE *out, void *x) {
  BIO *b = BIO_new_fp(out, BIO_NOCLOSE);
  if (b == NULL) {
    OPENSSL_PUT_ERROR(ASN1, ERR_R_BUF_LIB);
    return 0;
  }
  int ret = ASN1_item_i2d_bio(it, b, x);
  BIO_free(b);
  return ret;
}